

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O3

d_flags restore_d_flags(memfile *mf)

{
  uint uVar1;
  
  uVar1 = mread32(mf);
  return (d_flags)(uVar1 >> 0x15 & 0x70 |
                  uVar1 >> 0x19 & 8 | uVar1 >> 0x1b & 4 | uVar1 >> 0x1d & 2 | uVar1 >> 0x1f);
}

Assistant:

d_flags restore_d_flags(struct memfile *mf)
{
    unsigned int dflags;
    d_flags f;
    
    dflags = mread32(mf);
    f.town = (dflags >> 31) & 1;
    f.hellish = (dflags >> 30) & 1;
    f.maze_like = (dflags >> 29) & 1;
    f.rogue_like = (dflags >> 28) & 1;
    f.align = (dflags >> 25) & 7;
    
    return f;
}